

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O0

newtRef NsPrimClassOf(newtRefArg rcvr,newtRefArg r)

{
  _Bool _Var1;
  uint16_t uVar2;
  newtRefVar local_20;
  newtRefVar klass;
  newtRefArg r_local;
  newtRefArg rcvr_local;
  
  _Var1 = NewtRefIsPointer(r);
  if (_Var1) {
    uVar2 = NewtGetRefType(r,true);
    if (uVar2 == 10) {
      local_20 = newt_sym.array;
    }
    else if (uVar2 == 0xb) {
      local_20 = newt_sym.frame;
    }
    else {
      local_20 = newt_sym.binary;
    }
  }
  else {
    local_20 = NewtMakeSymbol("immediate");
  }
  return local_20;
}

Assistant:

newtRef NsPrimClassOf(newtRefArg rcvr, newtRefArg r)
{
    newtRefVar	klass;
    
    if (NewtRefIsPointer(r))
    {
        switch (NewtGetRefType(r, true))
        {
            case kNewtFrame:
                klass = NSSYM0(frame);
                break;
                
            case kNewtArray:
                klass = NSSYM0(array);
                break;
                
            default:
                klass = NSSYM0(binary);
                break;
        }
    }
    else
    {
        klass = NSSYM(immediate);
    }
    
    return klass;
}